

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void rd_1dim_slice(char **content,size_t *line_no,int *array,int dim,int shift,int post)

{
  size_t sVar1;
  char *line;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  double dVar8;
  int p;
  int pp;
  int local_6c;
  int local_68;
  int local_64;
  int *local_60;
  uint local_58 [4];
  double local_48;
  char **local_40;
  size_t *local_38;
  
  iVar3 = dim - (post + shift);
  if (0 < iVar3) {
    local_60 = array + shift;
    local_68 = 0;
    iVar4 = 0;
    local_40 = content;
    local_38 = line_no;
    do {
      sVar1 = *local_38;
      *local_38 = sVar1 + 1;
      line = local_40[sVar1];
      if (line == (char *)0x0) {
        vrna_message_error("unexpected end of file in get_array1");
      }
      ignore_comment(line);
      if (iVar4 < iVar3) {
        lVar6 = 0;
        do {
          piVar5 = local_60 + iVar4;
          iVar7 = iVar4;
          while( true ) {
            iVar2 = __isoc99_sscanf(line + (int)lVar6,"%15s%n",local_58,&local_64);
            iVar4 = iVar7;
            if (iVar2 != 1) goto LAB_001290c5;
            lVar6 = (long)local_64 + (long)(int)lVar6;
            if ((local_58[0] & 0xff) != 0x2a) break;
            iVar7 = iVar7 + 1;
            piVar5 = piVar5 + 1;
            if (iVar3 <= iVar7) {
              return;
            }
          }
          if ((local_58[0] & 0xff) == 0x78) {
            if (iVar7 == 0) {
              vrna_message_error("can\'t extrapolate first value");
            }
            iVar4 = local_60[local_68];
            local_48 = lxc37;
            dVar8 = log((double)iVar7 / (double)local_68);
            local_6c = (int)(dVar8 * local_48 + 0.5) + iVar4;
            iVar4 = local_68;
          }
          else {
            iVar4 = local_68;
            if (local_58[0] == 0x54534e) {
              local_6c = 0;
            }
            else if (local_58[0] == 0x464e49) {
              local_6c = 10000000;
            }
            else if (local_58[0] == 0x464544) {
              local_6c = -0x32;
            }
            else {
              iVar2 = __isoc99_sscanf(local_58,"%d",&local_6c);
              iVar4 = iVar7;
              if (iVar2 != 1) {
                if (line == (char *)0x0) {
                  return;
                }
                vrna_message_error("\nrd_1dim: %s",line + lVar6);
              }
            }
          }
          local_68 = iVar4;
          iVar4 = iVar7 + 1;
          *piVar5 = local_6c;
        } while (iVar4 < iVar3);
        iVar4 = iVar7 + 1;
      }
LAB_001290c5:
    } while (iVar4 < iVar3);
  }
  return;
}

Assistant:

PRIVATE void
rd_1dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim,
              int     shift,
              int     post)
{
  char *cp;

  cp = get_array1(content, line_no, array + shift, dim - shift - post);

  if (cp) {
    vrna_message_error("\nrd_1dim: %s", cp);
    exit(1);
  }

  return;
}